

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O1

bool __thiscall
pbrt::DisplayItem::ImageChannelBuffer::SendIfChanged
          (ImageChannelBuffer *this,IPCChannel *ipcChannel,int tileIndex)

{
  int iVar1;
  pointer puVar2;
  bool bVar3;
  ulong uVar4;
  bool bVar5;
  long lVar6;
  ulong uVar7;
  span<const_unsigned_char> message;
  
  iVar1 = this->setCount;
  if (0x4000 < (long)iVar1) {
    memset((this->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start + (long)iVar1 * 4 + (long)this->channelValuesOffset,0,
           (ulong)(iVar1 - 0x4000) << 2);
  }
  puVar2 = (this->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = 0xa7935bd1e9950000;
  lVar6 = 0;
  do {
    uVar7 = *(long *)(puVar2 + lVar6 + this->channelValuesOffset) * -0x395b586ca42e166b;
    lVar6 = lVar6 + 8;
    uVar4 = (uVar4 ^ (uVar7 >> 0x2f ^ uVar7) * -0x395b586ca42e166b) * -0x395b586ca42e166b;
  } while (lVar6 != 0x10000);
  uVar4 = (uVar4 >> 0x2f ^ uVar4) * -0x395b586ca42e166b;
  uVar4 = uVar4 >> 0x2f ^ uVar4;
  bVar5 = true;
  if (uVar4 != (this->tileHashes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start[tileIndex]) {
    message.n = (long)this->channelValuesOffset + (long)this->setCount * 4;
    message.ptr = puVar2;
    bVar3 = IPCChannel::Send(ipcChannel,message);
    if (bVar3) {
      (this->tileHashes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[tileIndex] = uVar4;
    }
    else {
      bVar5 = false;
    }
  }
  return bVar5;
}

Assistant:

bool DisplayItem::ImageChannelBuffer::SendIfChanged(IPCChannel &ipcChannel,
                                                    int tileIndex) {
    int excess = setCount - tileSize * tileSize;
    if (excess > 0)
        memset(buffer.data() + channelValuesOffset + setCount * sizeof(float), 0,
               excess * sizeof(float));

    uint64_t hash = HashBuffer(buffer.data() + channelValuesOffset,
                               tileSize * tileSize * sizeof(float));
    if (hash == tileHashes[tileIndex])
        return true;

    if (!ipcChannel.Send(pstd::MakeSpan(buffer.data(),
                                        channelValuesOffset + setCount * sizeof(float))))
        return false;

    tileHashes[tileIndex] = hash;
    return true;
}